

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O0

int ogg_stream_pageout(ogg_stream_state *os,ogg_page *og)

{
  int iVar1;
  int local_24;
  int force;
  ogg_page *og_local;
  ogg_stream_state *os_local;
  
  local_24 = 0;
  iVar1 = ogg_stream_check(os);
  if (iVar1 == 0) {
    if (((os->e_o_s != 0) && (os->lacing_fill != 0)) || ((os->lacing_fill != 0 && (os->b_o_s == 0)))
       ) {
      local_24 = 1;
    }
    os_local._4_4_ = ogg_stream_flush_i(os,og,local_24,0x1000);
  }
  else {
    os_local._4_4_ = 0;
  }
  return os_local._4_4_;
}

Assistant:

int ogg_stream_pageout(ogg_stream_state *os, ogg_page *og){
  int force=0;
  if(ogg_stream_check(os)) return 0;

  if((os->e_o_s&&os->lacing_fill) ||          /* 'were done, now flush' case */
     (os->lacing_fill&&!os->b_o_s))           /* 'initial header page' case */
    force=1;

  return(ogg_stream_flush_i(os,og,force,4096));
}